

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

int Wlc_NtkMemAbstract(Wlc_Ntk_t *p,int nIterMax,int fDumpAbs,int fPdrVerbose,int fVerbose)

{
  int iVar1;
  Vec_Wec_t *vConstrs;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  Wlc_Ntk_t *pWVar4;
  Gia_Man_t *pGVar5;
  Aig_Man_t *pAVar6;
  Aig_Man_t *p_00;
  Vec_Wrd_t *vValues;
  abctime aVar7;
  ulong uVar8;
  long lVar9;
  int level;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  Abc_Cex_t *pCex;
  int local_164;
  uint local_160;
  int iFirstMemCi;
  int iFirstCi;
  int iFirstMemPi;
  Wlc_Ntk_t *local_150;
  int local_144;
  Gia_Man_t *local_140;
  Vec_Int_t *local_138;
  Vec_Int_t *local_130;
  abctime local_128;
  Vec_Int_t *local_120;
  Vec_Wec_t *local_118;
  Vec_Int_t *vFirstTotal;
  Vec_Int_t *vMemFanins;
  Vec_Int_t *vMemObjs;
  Vec_Int_t *vNodeFrames;
  Pdr_Par_t PdrPars;
  
  pWVar4 = p;
  local_160 = nIterMax;
  local_144 = fDumpAbs;
  local_128 = Abc_Clock();
  pCex = (Abc_Cex_t *)0x0;
  vConstrs = Vec_WecAlloc((int)pWVar4);
  local_138 = Vec_IntAlloc(100);
  vNodeFrames = local_138;
  pVVar2 = Wlc_NtkCollectMemory(p,0);
  local_150 = p;
  vMemObjs = pVVar2;
  pVVar3 = Wlc_NtkCollectMemFanins(p,pVVar2);
  vMemFanins = pVVar3;
  pWVar4 = Wlc_NtkAbstractMemory
                     (p,pVVar2,pVVar3,&iFirstMemPi,&iFirstCi,&iFirstMemCi,(Vec_Wec_t *)0x0,
                      (Vec_Int_t *)0x0);
  iVar1 = Wlc_CountDcs(pWVar4->pInits);
  local_130 = pVVar2;
  local_120 = Wlc_NtkDeriveFirstTotal
                        (local_150,pVVar2,pVVar3,iFirstMemPi,iFirstMemCi + iVar1,fVerbose);
  vFirstTotal = local_120;
  local_140 = Wlc_NtkBitBlast(pWVar4,(Wlc_BstPar_t *)0x0);
  if (local_140->vCis->nSize - local_140->nRegs != iVar1 + iFirstCi) {
    __assert_fail("Gia_ManPiNum(pAbsFull) == iFirstCi + nDcBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcMem.c"
                  ,0x3ec,"int Wlc_NtkMemAbstract(Wlc_Ntk_t *, int, int, int, int)");
  }
  Wlc_NtkFree(pWVar4);
  if ((int)local_160 < 1) {
    local_160 = 0;
  }
  local_164 = -1;
  uVar11 = 0;
  pWVar4 = local_150;
  local_118 = vConstrs;
  do {
    uVar12 = local_160;
    if (local_160 == uVar11) {
LAB_002e63ec:
      Gia_ManStop(local_140);
      Vec_WecFree(vConstrs);
      Vec_IntFreeP(&vMemObjs);
      Vec_IntFreeP(&vMemFanins);
      Vec_IntFreeP(&vFirstTotal);
      Vec_IntFreeP(&vNodeFrames);
      if (fVerbose != 0) {
        putchar(10);
      }
      printf("Abstraction ");
      iVar1 = local_164;
      if (pCex == (Abc_Cex_t *)0x0 || local_164 != 0) {
        if (local_164 == 1) {
          pcVar10 = "is successfully proved";
        }
        else {
          pcVar10 = "timed out";
        }
        printf(pcVar10);
      }
      else {
        printf("resulted in a real CEX in frame %d",(ulong)(uint)pCex->iFrame);
      }
      level = 0x747daf;
      printf(" after %d iterations. ",(ulong)uVar12);
      aVar7 = Abc_Clock();
      lVar9 = aVar7 - local_128;
      Abc_Print(level,"%s =","Time");
      Abc_Print(level,"%9.2f sec\n",SUB84((double)lVar9 / 1000000.0,0));
      Abc_CexFreeP(&pCex);
      return iVar1;
    }
    Pdr_ManSetDefaultParams(&PdrPars);
    PdrPars.fUseAbs = 0;
    PdrPars.fVerbose = fVerbose;
    pWVar4 = Wlc_NtkAbstractMemory
                       (pWVar4,local_130,(Vec_Int_t *)0x0,&iFirstMemPi,&iFirstCi,&iFirstMemCi,
                        vConstrs,local_138);
    pGVar5 = Wlc_NtkBitBlast(pWVar4,(Wlc_BstPar_t *)0x0);
    pAVar6 = Gia_ManToAigSimple(pGVar5);
    Gia_ManStop(pGVar5);
    pAVar6->nConstrs = 1;
    p_00 = Saig_ManDupFoldConstrsFunc(pAVar6,0,0);
    Aig_ManStop(pAVar6);
    pGVar5 = Gia_ManFromAigSimple(p_00);
    Aig_ManStop(p_00);
    pAVar6 = Gia_ManToAigSimple(pGVar5);
    local_164 = Pdr_ManSolve(pAVar6,&PdrPars);
    pCex = pAVar6->pSeqModel;
    pAVar6->pSeqModel = (Abc_Cex_t *)0x0;
    Aig_ManStop(pAVar6);
    if (fVerbose != 0) {
      pcVar10 = "\nITERATIONS %d:\n";
      printf("\nITERATIONS %d:\n",(ulong)uVar11);
      Wlc_NtkPrintCex((Wlc_Ntk_t *)pcVar10,pWVar4,pCex);
    }
    Wlc_NtkFree(pWVar4);
    vConstrs = local_118;
    if (local_144 != 0) {
      Gia_AigerWrite(pGVar5,"mem_abs.aig",0,0,0);
      uVar8 = 0xffffffffffffffff;
      if (pCex != (Abc_Cex_t *)0x0) {
        uVar8 = (ulong)(uint)pCex->iFrame;
      }
      printf("Iteration %3d: Dumped abstraction in file \"%s\" after finding CEX in frame %d.\n",
             (ulong)uVar11,"mem_abs.aig",uVar8);
    }
    uVar12 = uVar11;
    if (pCex == (Abc_Cex_t *)0x0) {
      if (local_164 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcMem.c"
                      ,0x41e,"int Wlc_NtkMemAbstract(Wlc_Ntk_t *, int, int, int, int)");
      }
      Gia_ManStop(pGVar5);
      goto LAB_002e63ec;
    }
    vValues = Wlc_NtkConvertCex(local_120,local_140,pCex,fVerbose);
    Gia_ManStop(pGVar5);
    pWVar4 = local_150;
    pVVar2 = Wlc_NtkFindConflict(local_150,local_130,vValues,pCex->iFrame + 1);
    free(vValues->pArray);
    free(vValues);
    if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_002e63ec;
    Abc_CexFreeP(&pCex);
    if (fVerbose != 0) {
      Wlc_NtkPrintConflict(pWVar4,pVVar2);
    }
    Vec_WecPushLevel(vConstrs);
    pVVar3 = Vec_WecEntryLast(vConstrs);
    Vec_IntAppend(pVVar3,pVVar2);
    Wlc_NtkAbsAddToNodeFrames(local_138,pVVar2);
    Vec_IntFree(pVVar2);
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

int Wlc_NtkMemAbstract( Wlc_Ntk_t * p, int nIterMax, int fDumpAbs, int fPdrVerbose, int fVerbose )
{
    abctime clk = Abc_Clock();
    Wlc_Ntk_t * pNewFull, * pNew; Aig_Man_t * pAig, * pTempAig;
    Gia_Man_t * pAbsFull, * pAbs;
    Abc_Cex_t * pCex = NULL;  Vec_Wrd_t * vValues = NULL; 
    Vec_Wec_t * vRefines = Vec_WecAlloc( 100 );
    Vec_Int_t * vNodeFrames = Vec_IntAlloc( 100 );
    Vec_Int_t * vMemObjs, * vMemFanins, * vFirstTotal, * vRefine; 
    int RetValue = -1, iFirstMemPi, iFirstCi, iFirstMemCi, nDcBits, nIters;

    vMemObjs    = Wlc_NtkCollectMemory( p, 0 );
    vMemFanins  = Wlc_NtkCollectMemFanins( p, vMemObjs );
    pNewFull    = Wlc_NtkAbstractMemory( p, vMemObjs, vMemFanins, &iFirstMemPi, &iFirstCi, &iFirstMemCi, NULL, NULL );
    nDcBits     = Wlc_CountDcs( pNewFull->pInits );
    vFirstTotal = Wlc_NtkDeriveFirstTotal( p, vMemObjs, vMemFanins, iFirstMemPi, nDcBits + iFirstMemCi, fVerbose );

    pAbsFull    = Wlc_NtkBitBlast( pNewFull, NULL );
    assert( Gia_ManPiNum(pAbsFull) == iFirstCi + nDcBits );
    Wlc_NtkFree( pNewFull );

    // perform abstraction
    for ( nIters = 0; nIters < nIterMax; nIters++ )
    {
        // set up parameters to run PDR
        Pdr_Par_t PdrPars, * pPdrPars = &PdrPars;
        Pdr_ManSetDefaultParams( pPdrPars );
        pPdrPars->fUseAbs    = 0;   // use 'pdr -t'  (on-the-fly abstraction)
        pPdrPars->fVerbose   = fVerbose;

        // derive specific abstraction
        pNew = Wlc_NtkAbstractMemory( p, vMemObjs, NULL, &iFirstMemPi, &iFirstCi, &iFirstMemCi, vRefines, vNodeFrames );
        pAbs = Wlc_NtkBitBlast( pNew, NULL );
        // simplify the AIG
        //pAbs = Gia_ManSeqStructSweep( pGiaTemp = pAbs, 1, 1, 0 );
        //Gia_ManStop( pGiaTemp );

        // roll in the constraints
        pAig = Gia_ManToAigSimple( pAbs );
        Gia_ManStop( pAbs );
        pAig->nConstrs = 1;
        pAig = Saig_ManDupFoldConstrsFunc( pTempAig = pAig, 0, 0 );
        Aig_ManStop( pTempAig );
        pAbs = Gia_ManFromAigSimple( pAig );
        Aig_ManStop( pAig );

        // try to prove abstracted GIA by converting it to AIG and calling PDR
        pAig = Gia_ManToAigSimple( pAbs );
        RetValue = Pdr_ManSolve( pAig, pPdrPars );
        pCex = pAig->pSeqModel; pAig->pSeqModel = NULL;
        Aig_ManStop( pAig );

        if ( fVerbose )
            printf( "\nITERATIONS %d:\n", nIters );
        if ( fVerbose )
            Wlc_NtkPrintCex( p, pNew, pCex );
        Wlc_NtkFree( pNew );

        if ( fDumpAbs )
        {
            char * pFileName = "mem_abs.aig";
            Gia_AigerWrite( pAbs, pFileName, 0, 0, 0 );
            printf( "Iteration %3d: Dumped abstraction in file \"%s\" after finding CEX in frame %d.\n", nIters, pFileName, pCex ? pCex->iFrame : -1 );
        }

        // check if proved or undecided
        if ( pCex == NULL ) 
        {
            assert( RetValue );
            Gia_ManStop( pAbs );
            break;
        }

        // analyze counter-example
        vValues = Wlc_NtkConvertCex( vFirstTotal, pAbsFull, pCex, fVerbose );
        Gia_ManStop( pAbs );
        vRefine = Wlc_NtkFindConflict( p, vMemObjs, vValues, pCex->iFrame + 1 );
        Vec_WrdFree( vValues );
        if ( vRefine == NULL ) // cannot refine
            break;
        Abc_CexFreeP( &pCex );

        // save refinement for the future
        if ( fVerbose )
            Wlc_NtkPrintConflict( p, vRefine );
        Vec_WecPushLevel( vRefines );
        Vec_IntAppend( Vec_WecEntryLast(vRefines), vRefine );
        Wlc_NtkAbsAddToNodeFrames( vNodeFrames, vRefine );
        Vec_IntFree( vRefine );
    }
    // cleanup
    Gia_ManStop( pAbsFull );
    Vec_WecFree( vRefines );
    Vec_IntFreeP( &vMemObjs );
    Vec_IntFreeP( &vMemFanins );
    Vec_IntFreeP( &vFirstTotal );
    Vec_IntFreeP( &vNodeFrames );

    // report the result
    if ( fVerbose )
        printf( "\n" );
    printf( "Abstraction " );
    if ( RetValue == 0 && pCex )
        printf( "resulted in a real CEX in frame %d", pCex->iFrame );
    else if ( RetValue == 1 )
        printf( "is successfully proved" );
    else 
        printf( "timed out" );
    printf( " after %d iterations. ", nIters );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Abc_CexFreeP( &pCex ); // return CEX in the future
    return RetValue;
}